

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O0

void __thiscall
dlib::bn_<(dlib::layer_mode)0>::
setup<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::con_<64l,7l,7l,2,2,0,0>,dlib::input_rgb_image,void>,true,void>>
          (bn_<(dlib::layer_mode)0> *this,
          subnet_wrapper<dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_true,_void>
          *sub)

{
  tensor *ptVar1;
  resizable_tensor *this_00;
  resizable_tensor *this_01;
  long in_RDI;
  size_t in_stack_00000088;
  tensor *in_stack_00000090;
  alias_tensor *in_stack_00000098;
  undefined4 in_stack_fffffffffffffe08;
  float in_stack_fffffffffffffe0c;
  alias_tensor_instance *in_stack_fffffffffffffe10;
  longlong in_stack_fffffffffffffe18;
  longlong in_stack_fffffffffffffe20;
  longlong in_stack_fffffffffffffe28;
  resizable_tensor *in_stack_fffffffffffffe30;
  tensor local_140 [6];
  
  ptVar1 = dimpl::
           subnet_wrapper<dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_true,_void>
           ::get_output((subnet_wrapper<dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_true,_void>
                         *)0x1e0261);
  tensor::k(ptVar1);
  alias_tensor::alias_tensor
            ((alias_tensor *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(longlong)in_stack_fffffffffffffe10
            );
  alias_tensor::operator=
            ((alias_tensor *)in_stack_fffffffffffffe10,
             (alias_tensor *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  alias_tensor::~alias_tensor((alias_tensor *)0x1e02b4);
  alias_tensor::operator=
            ((alias_tensor *)in_stack_fffffffffffffe10,
             (alias_tensor *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  alias_tensor::size((alias_tensor *)(in_RDI + 0x98));
  alias_tensor::size((alias_tensor *)(in_RDI + 0xe0));
  resizable_tensor::set_size
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,(longlong)in_stack_fffffffffffffe10);
  alias_tensor::operator()(in_stack_00000098,in_stack_00000090,in_stack_00000088);
  alias_tensor_instance::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
  alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x1e0346);
  this_00 = (resizable_tensor *)(in_RDI + 0xe0);
  alias_tensor::size((alias_tensor *)(in_RDI + 0x98));
  alias_tensor::operator()(in_stack_00000098,in_stack_00000090,in_stack_00000088);
  alias_tensor_instance::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
  alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x1e03a1);
  ptVar1 = local_140;
  alias_tensor::operator()(in_stack_00000098,in_stack_00000090,in_stack_00000088);
  resizable_tensor::copy_size(this_00,ptVar1);
  alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x1e03f2);
  this_01 = (resizable_tensor *)(in_RDI + 0x2f0);
  alias_tensor::operator()(in_stack_00000098,in_stack_00000090,in_stack_00000088);
  resizable_tensor::copy_size(this_00,ptVar1);
  alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x1e043d);
  resizable_tensor::operator=(this_01,in_stack_fffffffffffffe0c);
  resizable_tensor::operator=(this_01,in_stack_fffffffffffffe0c);
  *(undefined8 *)(in_RDI + 0x388) = 0;
  return;
}

Assistant:

void setup (const SUBNET& sub)
        {
            if (mode == FC_MODE)
            {
                gamma = alias_tensor(1,
                                sub.get_output().k(),
                                sub.get_output().nr(),
                                sub.get_output().nc());
            }
            else
            {
                gamma = alias_tensor(1, sub.get_output().k());
            }
            beta = gamma;

            params.set_size(gamma.size()+beta.size());

            gamma(params,0) = 1;
            beta(params,gamma.size()) = 0;

            running_means.copy_size(gamma(params,0));
            running_variances.copy_size(gamma(params,0));
            running_means = 0;
            running_variances = 1;
            num_updates = 0;
        }